

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall StatisticsTracker::update(StatisticsTracker *this,double value)

{
  double dVar1;
  double dVar2;
  double scale;
  double delta;
  double value_local;
  StatisticsTracker *this_local;
  
  this->_count = this->_count + 1;
  if (this->_count == 1) {
    if (((this->_options).doMin & 1U) != 0) {
      this->_minimum = value;
    }
    if (((this->_options).doMax & 1U) != 0) {
      this->_maximum = value;
    }
    if (((this->_options).doMean & 1U) != 0) {
      this->_mean = value;
    }
    if (((this->_options).doVar & 1U) != 0) {
      this->_variance = 0.0;
    }
    if (((this->_options).histogramOptions.enabled & 1U) != 0) {
      DynamicHistogram<double>::add(&this->_histogram,value);
    }
  }
  else {
    if ((((this->_options).doMin & 1U) != 0) && (value < this->_minimum)) {
      this->_minimum = value;
    }
    if ((((this->_options).doMax & 1U) != 0) && (this->_maximum <= value && value != this->_maximum)
       ) {
      this->_maximum = value;
    }
    if ((((this->_options).doMean & 1U) != 0) || (((this->_options).doVar & 1U) != 0)) {
      dVar1 = value - this->_mean;
      if (((this->_options).doMean & 1U) != 0) {
        this->_mean = dVar1 / (double)this->_count + this->_mean;
      }
      if (((this->_options).doVar & 1U) != 0) {
        dVar2 = ((double)this->_count - 1.0) / (double)this->_count;
        this->_variance = dVar2 * this->_variance;
        this->_variance = (dVar1 * dVar1 * dVar2) / (double)this->_count + this->_variance;
      }
    }
    if (((this->_options).histogramOptions.enabled & 1U) != 0) {
      DynamicHistogram<double>::add(&this->_histogram,value);
    }
  }
  return;
}

Assistant:

void
    update(double const value)
    {

        // update counter
        this->_count++;

        // initialize if first value
        if (this->_count == 1)
        {
            if (this->_options.doMin)
            {
                this->_minimum = value;
            }
            if (this->_options.doMax)
            {
                this->_maximum = value;
            }
            if (this->_options.doMean)
            {
                this->_mean = value;
            }
            if (this->_options.doVar)
            {
                this->_variance = 0;
            }
            if (this->_options.histogramOptions.enabled)
            {
                this->_histogram.add(value);
            }
            return;
        }

        // update min
        if (this->_options.doMin)
        {
            if (value < this->_minimum)
            {
                this->_minimum = value;
            }
        }

        // update max
        if (this->_options.doMax)
        {
            if (value > this->_maximum)
            {
                this->_maximum = value;
            }
        }

        if (this->_options.doMean || this->_options.doVar)
        {
            double delta = value - this->_mean;

            if (this->_options.doMean)
            {
                // update mean
                this->_mean += delta / (double) this->_count;
            }

            if (this->_options.doVar)
            {
                // update variance
                double scale = (this->_count - 1.0) / (double) this->_count;
                this->_variance *= scale;
                this->_variance += delta * delta * scale / (double) this->_count;
                
            }

        }

        if (this->_options.histogramOptions.enabled)
        {
            this->_histogram.add(value);
        }

    }